

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itree.c
# Opt level: O2

itree_t * itree_new(uint32 n_cell_hint)

{
  itree_t *piVar1;
  cell_t *pcVar2;
  long lVar3;
  
  piVar1 = (itree_t *)
           __ckd_calloc__(1,0x10,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/itree.c"
                          ,0x3f);
  pcVar2 = (cell_t *)
           __ckd_calloc__((ulong)n_cell_hint,0xc,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/itree.c"
                          ,0x40);
  piVar1->cell = pcVar2;
  for (lVar3 = 0; (ulong)n_cell_hint * 0xc - lVar3 != 0; lVar3 = lVar3 + 0xc) {
    *(undefined8 *)((long)&pcVar2->id + lVar3) = 0xffffffffffffffff;
    *(undefined4 *)((long)&pcVar2->sib + lVar3) = 0xffffffff;
  }
  piVar1->max_n_cell = n_cell_hint;
  return piVar1;
}

Assistant:

itree_t *
itree_new(uint32 n_cell_hint)
{
    itree_t *new;
    uint32 i;

    new = ckd_calloc(1, sizeof(itree_t));
    new->cell = ckd_calloc(n_cell_hint, sizeof(cell_t));
    for (i = 0; i < n_cell_hint; i++) {
	new->cell[i].id = NO_ID;
	new->cell[i].sib = NULL_INDEX;
	new->cell[i].child = NULL_INDEX;
    }
    new->max_n_cell = n_cell_hint;

    return new;
}